

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ClearOpsBufferStorageTestCase::execute
          (ClearOpsBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  byte bVar1;
  byte bVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint data_rgba8;
  ClearOpsBufferStorageTestCase *local_1c0;
  char *local_1b8;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  data_rgba8 = 0x12345678;
  bVar8 = true;
  iVar5 = 0;
  local_1c0 = this;
  do {
    if (iVar5 == 2) {
      return bVar8;
    }
    local_1b8 = "glClearBufferSubData()";
    if (iVar5 == 0) {
      local_1b8 = "glClearBufferData()";
    }
    for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
      if (iVar4 != 0) {
        (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bo);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x678);
        uVar10 = (ulong)(this->m_sparse_bo_size_rounded >> 1);
        (*this->m_gl->bufferPageCommitmentARB)(0x8892,uVar10,uVar10,'\x01');
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x67d);
      }
      (*this->m_gl->bindBuffer)(0x8892,this->m_helper_bo);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBindBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x682);
      (*this->m_gl->bufferSubData)
                (0x8892,0,(ulong)this->m_sparse_bo_size_rounded,this->m_initial_data);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x686);
      (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
      (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glBindBuffer() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x68a);
      (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x691);
      uVar14 = this->m_sparse_bo_size_rounded;
      if (iVar5 == 0) {
        (*this->m_gl->clearBufferData)(0x8f37,0x8058,0x1908,0x1401,&data_rgba8);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glClearBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x69f);
        uVar13 = 0;
      }
      else {
        uVar13 = uVar14 >> 1;
        (*this->m_gl->clearBufferSubData)
                  (0x8f37,0x8058,(ulong)uVar13,(ulong)uVar13,0x1908,0x1401,&data_rgba8);
        GVar3 = (*this->m_gl->getError)();
        glu::checkError(GVar3,"glClearBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0x6ab);
        uVar14 = uVar13;
      }
      (*this->m_gl->copyBufferSubData)(0x8f37,0x8f36,0,0,(ulong)this->m_sparse_bo_size_rounded);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glCopyBufferSubData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6b6);
      pvVar6 = (*this->m_gl->mapBufferRange)(0x8f36,0,(ulong)this->m_sparse_bo_size_rounded,1);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x6bb);
      uVar9 = (ulong)uVar13;
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 - uVar9 == -1) {
          bVar15 = true;
          goto LAB_00ac2f33;
        }
        bVar1 = this->m_initial_data[uVar10 + 1];
        bVar2 = *(byte *)((long)pvVar6 + uVar10 + 1);
        uVar10 = uVar10 + 1;
      } while (bVar1 == bVar2);
      bVar15 = uVar9 <= uVar10;
      local_1b0 = (undefined1  [8])local_1c0->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,
                      "Unmodified buffer object region has invalid contents. Expected byte ");
      std::operator<<(&local_1a8,"[");
      std::ostream::operator<<((ostringstream *)&local_1a8,(uint)bVar1);
      std::operator<<(&local_1a8,"], found byte:[");
      std::ostream::operator<<((ostringstream *)&local_1a8,(uint)bVar2);
      std::operator<<(&local_1a8,"] at index [");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::operator<<(&local_1a8,"]; call type:[");
      std::operator<<(&local_1a8,local_1b8);
      std::operator<<(&local_1a8,"], all required pages committed?:[");
      pcVar11 = "no";
      if (iVar4 == 0) {
        pcVar11 = "yes";
      }
      std::operator<<(&local_1a8,pcVar11);
      std::operator<<(&local_1a8,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00ac2f33:
      if (iVar4 != 0) {
        uVar14 = 0;
      }
      iVar7 = uVar13 * 8;
      do {
        uVar10 = uVar9;
        if (uVar14 + uVar13 <= uVar10) goto LAB_00ac3077;
        bVar1 = *(byte *)((long)pvVar6 + uVar10);
        uVar12 = (0xff << ((byte)iVar7 & 0x1f) & 0x12345678U) >> ((byte)iVar7 & 0x1f) & 0x7e;
        iVar7 = iVar7 + 8;
        uVar9 = uVar10 + 1;
      } while (uVar12 == bVar1);
      local_1b0 = (undefined1  [8])local_1c0->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,
                      "Unmodified buffer object region has invalid contents. Expected byte ");
      std::operator<<(&local_1a8,"[");
      std::ostream::operator<<((ostringstream *)&local_1a8,uVar12);
      std::operator<<(&local_1a8,"], found byte:[");
      std::ostream::operator<<((ostringstream *)&local_1a8,(uint)bVar1);
      std::operator<<(&local_1a8,"] at index [");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::operator<<(&local_1a8,"]; call type:[");
      std::operator<<(&local_1a8,local_1b8);
      std::operator<<(&local_1a8,"], all required pages committed?:[");
      pcVar11 = "no";
      if (iVar4 == 0) {
        pcVar11 = "yes";
      }
      std::operator<<(&local_1a8,pcVar11);
      std::operator<<(&local_1a8,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00ac3077:
      this = local_1c0;
      bVar8 = (bool)(bVar8 & bVar15 & uVar14 + uVar13 <= uVar10);
      (*local_1c0->m_gl->unmapBuffer)(0x8f36);
      GVar3 = (*this->m_gl->getError)();
      glu::checkError(GVar3,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0x710);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool ClearOpsBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool			   result	 = true;
	const unsigned int data_rgba8 = 0x12345678;

	for (unsigned int n_clear_op_type = 0; n_clear_op_type < 2; /* glClearBufferData(), glClearBufferSubData() */
		 ++n_clear_op_type)
	{
		const bool use_clear_buffer_data_call = (n_clear_op_type == 0);

		/* We will run the test case in two iterations:
		 *
		 * 1) All pages will have a physical backing.
		 * 2) Half of the pages will have a physical backing.
		 */
		for (unsigned int n_iteration = 0; n_iteration < 2; ++n_iteration)
		{
			/* By default, for each iteration all sparse buffer pages are commited.
			 *
			 * For the last iteration, we need to de-commit the latter half before
			 * proceeding with the test.
			 */
			const bool all_pages_committed = (n_iteration == 0);

			if (!all_pages_committed)
			{
				m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

				m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, m_sparse_bo_size_rounded / 2, /* offset */
											 m_sparse_bo_size_rounded / 2,					/* size   */
											 GL_TRUE);										/* commit */
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			/* Set up the sparse buffer contents */
			m_gl.bindBuffer(GL_ARRAY_BUFFER, m_helper_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

			m_gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							   m_sparse_bo_size_rounded, m_initial_data);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");

			m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
			m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER,  /* readTarget  */
								   GL_COPY_WRITE_BUFFER, /* writeTarget */
								   0,					 /* readOffset */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			/* Issue the clear call */
			unsigned int clear_region_size		   = 0;
			unsigned int clear_region_start_offset = 0;

			if (use_clear_buffer_data_call)
			{
				DE_ASSERT((m_sparse_bo_size_rounded % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded;
				clear_region_start_offset = 0;

				m_gl.clearBufferData(GL_COPY_WRITE_BUFFER, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");
			}
			else
			{
				DE_ASSERT(((m_sparse_bo_size_rounded / 2) % sizeof(unsigned int)) == 0);
				DE_ASSERT(((m_sparse_bo_size_rounded) % sizeof(unsigned int)) == 0);

				clear_region_size		  = m_sparse_bo_size_rounded / 2;
				clear_region_start_offset = m_sparse_bo_size_rounded / 2;

				m_gl.clearBufferSubData(GL_COPY_WRITE_BUFFER, GL_RGBA8, clear_region_start_offset, clear_region_size,
										GL_RGBA, GL_UNSIGNED_BYTE, &data_rgba8);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferSubData() call failed.");
			}

			/* Retrieve the modified buffer's contents */
			const unsigned char* result_data = NULL;

			m_gl.copyBufferSubData(GL_COPY_WRITE_BUFFER, /* readTarget  */
								   GL_COPY_READ_BUFFER,  /* writeTarget */
								   0,					 /* readOffset  */
								   0,					 /* writeOffset */
								   m_sparse_bo_size_rounded);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			result_data = (unsigned char*)m_gl.mapBufferRange(GL_COPY_READ_BUFFER, 0, /* offset */
															  m_sparse_bo_size_rounded, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the result data: unmodified region */
			bool			   result_local			  = true;
			const unsigned int unmodified_region_size = (use_clear_buffer_data_call) ? 0 : clear_region_start_offset;
			const unsigned int unmodified_region_start_offset = 0;

			for (unsigned int n_current_byte = unmodified_region_start_offset;
				 (n_current_byte < unmodified_region_start_offset + unmodified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned int  current_initial_data_offset = n_current_byte - unmodified_region_start_offset;
				const unsigned char expected_value				= m_initial_data[current_initial_data_offset];
				const unsigned char found_value					= result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;
			result_local = true;

			/* Verify the result data: modified region (clamped to the memory region
			 * with actual physical backing) */
			const unsigned int modified_region_size			= (all_pages_committed) ? clear_region_size : 0;
			const unsigned int modified_region_start_offset = clear_region_start_offset;

			for (unsigned int n_current_byte = modified_region_start_offset;
				 (n_current_byte < modified_region_start_offset + modified_region_size) && result_local;
				 ++n_current_byte)
			{
				const unsigned char expected_value =
					static_cast<unsigned char>((data_rgba8 & (0xFF << (n_current_byte * 8))) >> (n_current_byte * 8));
				const unsigned char found_value = result_data[n_current_byte];

				if (expected_value != found_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Unmodified buffer object region has invalid contents. Expected byte "
									   << "[" << (int)expected_value << "]"
																		", found byte:"
																		"["
									   << (int)found_value << "]"
															  " at index "
															  "["
									   << n_current_byte << "]; "
															"call type:"
															"["
									   << ((use_clear_buffer_data_call) ? "glClearBufferData()" :
																		  "glClearBufferSubData()")
									   << "]"
										  ", all required pages committed?:"
										  "["
									   << ((all_pages_committed) ? "yes" : "no") << "]" << tcu::TestLog::EndMessage;

					result_local = false;
					break;
				}
			}

			result &= result_local;

			/* Unmap the storage before proceeding */
			m_gl.unmapBuffer(GL_COPY_READ_BUFFER);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");
		} /* for (both iterations) */
	}	 /* for (both clear types) */

	return result;
}